

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O2

string * cmdline::detail::demangle(string *__return_storage_ptr__,string *name)

{
  uint in_EAX;
  char *__ptr;
  int status;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)in_EAX;
  __ptr = (char *)__cxa_demangle((name->_M_dataplus)._M_p,0,0);
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,__ptr,(allocator *)((long)&uStack_18 + 3));
  free(__ptr);
  return __return_storage_ptr__;
}

Assistant:

static inline std::string demangle(const std::string
            &name)
            {
                int status = 0;
                char *p = abi::__cxa_demangle(name.c_str(), 0, 0, &status);
                std::string ret(p);
                free(p);
                return ret;
            }